

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  
  if (argc < 2) {
    testToFloat();
LAB_00104cf4:
    testSize();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104d09;
    }
    testArithmetic();
LAB_00104d38:
    testNormalizedConversionError();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104d4d;
    }
    testDenormalizedConversionError();
LAB_00104d7c:
    testRoundingError();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104d91;
    }
    testBitPatterns();
LAB_00104dc0:
    testClassification();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104dd5;
    }
    testLimits();
LAB_00104e04:
    testHalfLimits();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104e19;
    }
    testFunction();
LAB_00104e48:
    testVec();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104e5d;
    }
    testColor();
LAB_00104e8c:
    testShear();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104ea1;
    }
    testMatrix();
LAB_00104ed0:
    testMiscMatrixAlgo();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104ee5;
    }
    testRoots();
LAB_00104f14:
    testFun();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104f29;
    }
    testInvert();
LAB_00104f58:
    testInterval();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104f6d;
    }
    testFrustum();
LAB_00104f9c:
    testRandom();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104fb1;
    }
    testExtractEuler();
LAB_00104fe0:
    testExtractSHRT();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00104ff5;
    }
    testQuat();
LAB_00105024:
    testQuatSetRotation();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00105039;
    }
    testQuatSlerp();
LAB_00105068:
    testLineAlgo();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_0010507d;
    }
    testBoxAlgo();
LAB_001050ac:
    testBox();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_001050c1;
    }
    testProcrustes();
LAB_001050f0:
    testTinySVD();
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_00105105;
    }
    testJacobiEigenSolver();
LAB_00105134:
    testFrustumTest();
    if (argc < 2) {
      testInterop();
      goto LAB_00105178;
    }
    __s1 = argv[1];
  }
  else {
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"testToFloat");
    if (iVar1 == 0) {
      testToFloat();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testSize");
    if (iVar1 == 0) goto LAB_00104cf4;
LAB_00104d09:
    iVar1 = strcmp(__s1,"testArithmetic");
    if (iVar1 == 0) {
      testArithmetic();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testNormalizedConversionError");
    if (iVar1 == 0) goto LAB_00104d38;
LAB_00104d4d:
    iVar1 = strcmp(__s1,"testDenormalizedConversionError");
    if (iVar1 == 0) {
      testDenormalizedConversionError();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testRoundingError");
    if (iVar1 == 0) goto LAB_00104d7c;
LAB_00104d91:
    iVar1 = strcmp(__s1,"testBitPatterns");
    if (iVar1 == 0) {
      testBitPatterns();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testClassification");
    if (iVar1 == 0) goto LAB_00104dc0;
LAB_00104dd5:
    iVar1 = strcmp(__s1,"testLimits");
    if (iVar1 == 0) {
      testLimits();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testHalfLimits");
    if (iVar1 == 0) goto LAB_00104e04;
LAB_00104e19:
    iVar1 = strcmp(__s1,"testFunction");
    if (iVar1 == 0) {
      testFunction();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testVec");
    if (iVar1 == 0) goto LAB_00104e48;
LAB_00104e5d:
    iVar1 = strcmp(__s1,"testColor");
    if (iVar1 == 0) {
      testColor();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testShear");
    if (iVar1 == 0) goto LAB_00104e8c;
LAB_00104ea1:
    iVar1 = strcmp(__s1,"testMatrix");
    if (iVar1 == 0) {
      testMatrix();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testMiscMatrixAlgo");
    if (iVar1 == 0) goto LAB_00104ed0;
LAB_00104ee5:
    iVar1 = strcmp(__s1,"testRoots");
    if (iVar1 == 0) {
      testRoots();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testFun");
    if (iVar1 == 0) goto LAB_00104f14;
LAB_00104f29:
    iVar1 = strcmp(__s1,"testInvert");
    if (iVar1 == 0) {
      testInvert();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testInterval");
    if (iVar1 == 0) goto LAB_00104f58;
LAB_00104f6d:
    iVar1 = strcmp(__s1,"testFrustum");
    if (iVar1 == 0) {
      testFrustum();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testRandom");
    if (iVar1 == 0) goto LAB_00104f9c;
LAB_00104fb1:
    iVar1 = strcmp(__s1,"testExtractEuler");
    if (iVar1 == 0) {
      testExtractEuler();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testExtractSHRT");
    if (iVar1 == 0) goto LAB_00104fe0;
LAB_00104ff5:
    iVar1 = strcmp(__s1,"testQuat");
    if (iVar1 == 0) {
      testQuat();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testQuatSetRotation");
    if (iVar1 == 0) goto LAB_00105024;
LAB_00105039:
    iVar1 = strcmp(__s1,"testQuatSlerp");
    if (iVar1 == 0) {
      testQuatSlerp();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testLineAlgo");
    if (iVar1 == 0) goto LAB_00105068;
LAB_0010507d:
    iVar1 = strcmp(__s1,"testBoxAlgo");
    if (iVar1 == 0) {
      testBoxAlgo();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testBox");
    if (iVar1 == 0) goto LAB_001050ac;
LAB_001050c1:
    iVar1 = strcmp(__s1,"testProcrustes");
    if (iVar1 == 0) {
      testProcrustes();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testTinySVD");
    if (iVar1 == 0) goto LAB_001050f0;
LAB_00105105:
    iVar1 = strcmp(__s1,"testJacobiEigenSolver");
    if (iVar1 == 0) {
      testJacobiEigenSolver();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testFrustumTest");
    if (iVar1 == 0) goto LAB_00105134;
  }
  iVar1 = strcmp(__s1,"testInterop");
  if (iVar1 == 0) {
    testInterop();
    __s1 = argv[1];
  }
  iVar1 = strcmp(__s1,"testNoInterop");
  if (iVar1 != 0) {
    return 0;
  }
LAB_00105178:
  testNoInterop();
  return 0;
}

Assistant:

int
main (int argc, char* argv[])
{
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite
    TEST (testToFloat);
    TEST (testSize);
    TEST (testArithmetic);
    TEST (testNormalizedConversionError);
    TEST (testDenormalizedConversionError);
    TEST (testRoundingError);
    TEST (testBitPatterns);
    TEST (testClassification);
    TEST (testLimits);
    TEST (testHalfLimits);
    TEST (testFunction);
    TEST (testVec);
    TEST (testColor);
    TEST (testShear);
    TEST (testMatrix);
    TEST (testMiscMatrixAlgo);
    TEST (testRoots);
    TEST (testFun);
    TEST (testInvert);
    TEST (testInterval);
    TEST (testFrustum);
    TEST (testRandom);
    TEST (testExtractEuler);
    TEST (testExtractSHRT);
    TEST (testQuat);
    TEST (testQuatSetRotation);
    TEST (testQuatSlerp);
    TEST (testLineAlgo);
    TEST (testBoxAlgo);
    TEST (testBox);
    TEST (testProcrustes);
    TEST (testTinySVD);
    TEST (testJacobiEigenSolver);
    TEST (testFrustumTest);
    TEST (testInterop);
    TEST (testNoInterop);
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite

    return 0;
}